

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

bov_window_t * bov_window_new(int width,int height,char *win_name)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  PFNGLUNIFORM1IPROC p_Var5;
  int iVar6;
  GLuint GVar7;
  GLuint GVar8;
  GLuint GVar9;
  GLuint GVar10;
  GLuint GVar11;
  GLuint GVar12;
  GLuint GVar13;
  GLuint GVar14;
  GLuint GVar15;
  GLint GVar16;
  bov_window_t *window;
  GLFWmonitor *pGVar17;
  GLFWvidmode *pGVar18;
  GLFWwindow *handle;
  void *pvVar19;
  GLFWcursor *pGVar20;
  undefined1 *puVar21;
  bov_text_t *pbVar22;
  uint uVar23;
  uint uVar24;
  uchar (*pauVar25) [640];
  uchar *puVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  int iVar32;
  GLenum shaderType;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  undefined1 *puVar39;
  double dVar40;
  double dVar41;
  int height_local;
  int width_local;
  void *local_1c8;
  ulong local_1c0;
  GLuint local_1b4;
  double cursorY;
  double cursorX;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  GLuint local_16c;
  GLchar *local_168;
  GLchar *local_160;
  GLchar *local_158;
  GLchar *local_150;
  GLchar *local_148;
  GLchar *local_140;
  GLchar *local_138;
  GLchar *local_130;
  GLchar *local_128;
  GLchar *local_120;
  GLubyte local_118 [37];
  GLubyte local_f3 [195];
  
  height_local = height;
  width_local = width;
  window = (bov_window_t *)malloc(0xc0);
  if (window == (bov_window_t *)0x0) {
LAB_00106cb7:
    bov_window_new_cold_4();
  }
  else {
    glfwSetErrorCallback(error_callback);
    iVar6 = glfwInit();
    if (iVar6 == 0) goto LAB_00106cc1;
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x2100d,0);
    glfwWindowHint(0x22006,1);
    glfwWindowHint(0x22008,0x32001);
    if (width == 0 || height == 0) {
      pGVar17 = glfwGetPrimaryMonitor();
      pGVar18 = glfwGetVideoMode(pGVar17);
      window->size[0] = pGVar18->width;
      height = pGVar18->height;
      window->size[1] = height;
      width = pGVar18->width;
      pGVar17 = glfwGetPrimaryMonitor();
    }
    else {
      if (height < 0) {
        glfwWindowHint(0x20003,0);
        height = -height;
        height_local = height;
      }
      if (width < 0) {
        glfwWindowHint(0x20008,1);
        height = 100;
        width_local = 100;
        height_local = 100;
        width = 100;
      }
      window->size[0] = width;
      window->size[1] = height;
      pGVar17 = (GLFWmonitor *)0x0;
    }
    handle = glfwCreateWindow(width,height,win_name,pGVar17,(GLFWwindow *)0x0);
    window->self = handle;
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwSetWindowUserPointer(window->self,window);
      iVar6 = gladLoadGLLoader(glfwGetProcAddress);
      if (iVar6 == 0) {
        bov_window_new_cold_1();
      }
      (window->param).zoom = 1.0;
      glfwGetFramebufferSize(window->self,&width_local,&height_local);
      iVar32 = width_local;
      iVar6 = height_local;
      pvVar19 = glfwGetWindowUserPointer(window->self);
      *(ulong *)((long)pvVar19 + 0x10) = CONCAT44((float)iVar6,(float)iVar32);
      (*glad_glViewport)(0,0,iVar32,iVar6);
      (window->param).translate[0] = 0.0;
      (window->param).translate[1] = 0.0;
      window->wtime = 2.2250738585072014e-308;
      window->backgroundColor[0] = 1.0;
      window->backgroundColor[1] = 1.0;
      window->backgroundColor[2] = 1.0;
      window->backgroundColor[3] = 0.0;
      glfwSetKeyCallback(window->self,key_callback);
      glfwSetFramebufferSizeCallback(window->self,framebuffer_size_callback);
      glfwSetWindowSizeCallback(window->self,window_size_callback);
      glfwSetMouseButtonCallback(window->self,mouse_button_callback);
      glfwSetCursorPosCallback(window->self,cursor_pos_callback);
      glfwSetScrollCallback(window->self,scroll_callback);
      glfwSwapInterval(1);
      (*glad_glClearColor)
                (window->backgroundColor[0],window->backgroundColor[1],window->backgroundColor[2],
                 window->backgroundColor[3]);
      (*glad_glEnable)(0x809d);
      (*glad_glEnable)(0xb44);
      (*glad_glEnable)(0xbe2);
      (*glad_glBlendFunc)(0x302,0x303);
      (*glad_glPointSize)(5.0);
      (*glad_glEnable)(0xb20);
      glfwSetTime(2.2250738585072014e-308);
      cursorX = 0.0;
      cursorY = 0.0;
      glfwGetCursorPos(window->self,&cursorX,&cursorY);
      window->cursorPos[0] = (cursorX + cursorX) / (double)window->size[0] + -1.0;
      dVar40 = 1.0 - cursorY / (double)window->size[1];
      window->cursorPos[1] = dVar40 + dVar40 + -1.0;
      window->clickTime[0] = 0.0;
      window->clickTime[1] = 0.0;
      window->counter = 0;
      window->running = 1;
      window->help_needed = 0;
      window->indication_needed = 0;
      pGVar20 = glfwCreateStandardCursor(0x36005);
      window->leftClickCursor = pGVar20;
      (*glad_glGenBuffers)(2,window->ubo);
      (*glad_glBindBuffer)(0x8a11,window->ubo[0]);
      (*glad_glBufferData)(0x8a11,0x14,(void *)0x0,0x88e4);
      (*glad_glBindBufferRange)(0x8a11,0,window->ubo[0],0,0x14);
      (*glad_glBindBuffer)(0x8a11,window->ubo[1]);
      (*glad_glBufferData)(0x8a11,0x40,(void *)0x0,0x88e8);
      shaderType = 0x40;
      (*glad_glBindBufferRange)(0x8a11,1,window->ubo[1],0,0x40);
      (*glad_glBindBuffer)(0x8a11,0);
      cursorX = (double)text_vert;
      local_170 = 0xa42;
      GVar7 = LoadShader((GLsizei)&cursorX,(GLchar **)&local_170,(GLint *)"text_vert.glsl",
                         (char *)0x8b31,shaderType);
      if (GVar7 != 0) {
        cursorY = (double)text_frag;
        local_174 = 0xa1c;
        GVar8 = LoadShader((GLsizei)&cursorY,(GLchar **)&local_174,(GLint *)"text_frag.glsl",
                           (char *)0x8b30,shaderType);
        if (GVar8 != 0) {
          GVar9 = (*glad_glCreateProgram)();
          window->program[0] = GVar9;
          (*glad_glBindAttribLocation)(GVar9,0,"pos");
          (*glad_glBindAttribLocation)(window->program[0],1,"tex");
          GVar9 = GVar8;
          iVar6 = program_init(window,0,2,(ulong)GVar7);
          if (iVar6 == 0) {
            (*glad_glDetachShader)(window->program[0],GVar7);
            (*glad_glDetachShader)(window->program[0],GVar8);
            (*glad_glDeleteShader)(GVar7);
            (*glad_glDeleteShader)(GVar8);
            local_120 = points_vert;
            local_178 = 0x51;
            GVar7 = LoadShader((GLsizei)&local_120,(GLchar **)&local_178,(GLint *)"points_vert.glsl"
                               ,(char *)0x8b31,GVar9);
            if (GVar7 != 0) {
              local_128 = points_geom;
              local_17c = 0xd11;
              GVar8 = LoadShader((GLsizei)&local_128,(GLchar **)&local_17c,
                                 (GLint *)"points_geom.glsl",(char *)0x8dd9,GVar9);
              if (GVar8 != 0) {
                local_130 = lines_geom;
                local_180 = 0xd7f;
                GVar10 = LoadShader((GLsizei)&local_130,(GLchar **)&local_180,
                                    (GLint *)"lines_geom.glsl",(char *)0x8dd9,GVar9);
                if (GVar10 != 0) {
                  local_138 = curve_geom;
                  local_184 = 0x1672;
                  GVar11 = LoadShader((GLsizei)&local_138,(GLchar **)&local_184,
                                      (GLint *)"curve_geom.glsl",(char *)0x8dd9,GVar9);
                  if (GVar11 != 0) {
                    local_140 = triangles_geom;
                    local_188 = 0xf87;
                    GVar12 = LoadShader((GLsizei)&local_140,(GLchar **)&local_188,
                                        (GLint *)"triangles_geom.glsl",(char *)0x8dd9,GVar9);
                    if (GVar12 != 0) {
                      local_148 = points_frag;
                      local_18c = 0x101d;
                      GVar13 = LoadShader((GLsizei)&local_148,(GLchar **)&local_18c,
                                          (GLint *)"points_frag.glsl",(char *)0x8b30,GVar9);
                      local_1c0 = CONCAT44(local_1c0._4_4_,GVar13);
                      if (GVar13 != 0) {
                        local_150 = lines_frag;
                        local_190 = 0x7ff;
                        GVar13 = LoadShader((GLsizei)&local_150,(GLchar **)&local_190,
                                            (GLint *)"lines_frag.glsl",(char *)0x8b30,GVar9);
                        if (GVar13 != 0) {
                          local_158 = triangles_frag;
                          local_194 = 0x74c;
                          GVar14 = LoadShader((GLsizei)&local_158,(GLchar **)&local_194,
                                              (GLint *)"triangles_frag.glsl",(char *)0x8b30,GVar9);
                          if (GVar14 != 0) {
                            local_160 = default_vert;
                            local_198 = 0x8cf;
                            GVar15 = LoadShader((GLsizei)&local_160,(GLchar **)&local_198,
                                                (GLint *)"default_vert.glsl",(char *)0x8b31,GVar9);
                            if (GVar15 != 0) {
                              local_168 = default_frag;
                              local_19c = 0x646;
                              GVar9 = LoadShader((GLsizei)&local_168,(GLchar **)&local_19c,
                                                 (GLint *)"default_frag.glsl",(char *)0x8b30,GVar9);
                              local_1c8 = (void *)CONCAT44(local_1c8._4_4_,GVar9);
                              if (GVar9 != 0) {
                                GVar9 = (*glad_glCreateProgram)();
                                window->program[1] = GVar9;
                                GVar9 = (*glad_glCreateProgram)();
                                window->program[2] = GVar9;
                                GVar9 = (*glad_glCreateProgram)();
                                window->program[3] = GVar9;
                                GVar9 = (*glad_glCreateProgram)();
                                window->program[4] = GVar9;
                                GVar9 = (*glad_glCreateProgram)();
                                window->program[5] = GVar9;
                                local_1b4 = GVar7;
                                (*glad_glBindAttribLocation)(window->program[1],0,"pos");
                                (*glad_glBindAttribLocation)(window->program[2],0,"pos");
                                (*glad_glBindAttribLocation)(window->program[3],0,"pos");
                                (*glad_glBindAttribLocation)(window->program[4],0,"pos");
                                (*glad_glBindAttribLocation)(window->program[5],0,"pos");
                                GVar7 = local_1b4;
                                iVar6 = program_init(window,1,3,(ulong)local_1b4,(ulong)GVar8,
                                                     local_1c0 & 0xffffffff);
                                if (iVar6 == 0) {
                                  (*glad_glDetachShader)(window->program[1],GVar7);
                                  (*glad_glDetachShader)(window->program[1],GVar8);
                                  GVar9 = (GLuint)local_1c0;
                                  (*glad_glDetachShader)(window->program[1],(GLuint)local_1c0);
                                  (*glad_glDeleteShader)(GVar8);
                                  (*glad_glDeleteShader)(GVar9);
                                  iVar6 = program_init(window,2,3,(ulong)GVar7,(ulong)GVar10,
                                                       (ulong)GVar13);
                                  if (iVar6 == 0) {
                                    (*glad_glDetachShader)(window->program[2],GVar7);
                                    (*glad_glDetachShader)(window->program[2],GVar10);
                                    (*glad_glDetachShader)(window->program[2],GVar13);
                                    (*glad_glDeleteShader)(GVar10);
                                    iVar6 = program_init(window,3,3,(ulong)GVar7,(ulong)GVar11,
                                                         (ulong)GVar13);
                                    if (iVar6 == 0) {
                                      (*glad_glDetachShader)(window->program[3],GVar7);
                                      (*glad_glDetachShader)(window->program[3],GVar11);
                                      (*glad_glDetachShader)(window->program[3],GVar13);
                                      (*glad_glDeleteShader)(GVar11);
                                      (*glad_glDeleteShader)(GVar13);
                                      iVar6 = program_init(window,4,3,(ulong)GVar7,(ulong)GVar12);
                                      if (iVar6 == 0) {
                                        (*glad_glDetachShader)(window->program[4],GVar7);
                                        (*glad_glDetachShader)(window->program[4],GVar12);
                                        (*glad_glDetachShader)(window->program[4],GVar14);
                                        (*glad_glDeleteShader)(GVar7);
                                        (*glad_glDeleteShader)(GVar12);
                                        (*glad_glDeleteShader)(GVar14);
                                        iVar6 = program_init(window,5,2);
                                        if (iVar6 == 0) {
                                          (*glad_glDetachShader)(window->program[5],GVar15);
                                          GVar7 = (GLuint)local_1c8;
                                          uVar31 = (ulong)local_1c8 & 0xffffffff;
                                          (*glad_glDetachShader)
                                                    (window->program[5],(GLuint)local_1c8);
                                          (*glad_glDeleteShader)(GVar15);
                                          (*glad_glDeleteShader)(GVar7);
                                          iVar6 = 0x12c000;
                                          pvVar19 = malloc(0x12c000);
                                          if (pvVar19 != (void *)0x0) {
                                            puVar21 = (undefined1 *)((long)pvVar19 + 0x785);
                                            lVar27 = 0x11c71a;
                                            lVar38 = 1;
                                            uVar33 = 0;
                                            uVar24 = 0;
                                            uVar29 = 0xff;
                                            uVar34 = 0;
                                            do {
                                              local_1c0 = lVar38 + 1;
                                              uVar36 = (uint)font.tex_data[lVar38 + 1][0];
                                              bVar1 = font.tex_data[lVar38 + 1][1];
                                              lVar38 = -0x27e;
                                              puVar39 = puVar21;
                                              bVar2 = bVar1;
                                              uVar23 = uVar29;
                                              uVar37 = uVar34;
                                              uVar28 = uVar36;
                                              do {
                                                uVar35 = uVar23;
                                                uVar23 = uVar24;
                                                uVar30 = (uint)bVar2;
                                                uVar24 = (uint)*(byte *)(lVar27 + -0x282 + lVar38);
                                                puVar39[-2] = (char)uVar35;
                                                bVar3 = *(byte *)(lVar27 + -2 + lVar38);
                                                bVar4 = *(byte *)(lVar27 + 0x27e + lVar38);
                                                iVar6 = (uVar33 - bVar4) * 0x2f;
                                                iVar32 = (uVar28 - uVar24) * 0x2f +
                                                         (uVar37 - bVar3) * 0xa2 + iVar6;
                                                iVar6 = (uVar24 - uVar28) * 0x2f +
                                                        (uVar23 - bVar2) * 0xa2 + iVar6;
                                                dVar41 = SQRT((double)(iVar6 * iVar6 +
                                                                      iVar32 * iVar32));
                                                dVar40 = ((double)iVar32 / dVar41) * 128.0 + 128.0;
                                                if (dVar40 <= 0.0) {
                                                  dVar40 = 0.0;
                                                }
                                                if (255.9 <= dVar40) {
                                                  dVar40 = 255.9;
                                                }
                                                dVar41 = ((double)iVar6 / dVar41) * 128.0 + 128.0;
                                                if (dVar41 <= 0.0) {
                                                  dVar41 = 0.0;
                                                }
                                                if (255.9 <= dVar41) {
                                                  dVar41 = 255.9;
                                                }
                                                puVar39[-1] = (char)(int)dVar40;
                                                *puVar39 = (char)(int)dVar41;
                                                puVar39 = puVar39 + 3;
                                                lVar38 = lVar38 + 1;
                                                bVar2 = bVar4;
                                                uVar33 = uVar23;
                                                uVar23 = (uint)bVar3;
                                                uVar37 = uVar35;
                                                uVar28 = uVar30;
                                              } while (lVar38 != 0);
                                              puVar21 = puVar21 + 0x780;
                                              lVar27 = lVar27 + 0x280;
                                              lVar38 = local_1c0;
                                              uVar33 = uVar34;
                                              uVar24 = uVar29;
                                              uVar29 = (uint)bVar1;
                                              uVar34 = uVar36;
                                            } while (local_1c0 != 0x27f);
                                            lVar38 = 2;
                                            pauVar25 = font.tex_data;
                                            do {
                                              *(uchar *)((long)pvVar19 + lVar38 + -2) =
                                                   (*pauVar25)[0];
                                              *(undefined2 *)((long)pvVar19 + lVar38 + -1) = 0;
                                              lVar38 = lVar38 + 0x780;
                                              pauVar25 = pauVar25 + 1;
                                            } while (lVar38 != 0x12c002);
                                            lVar38 = 0x77f;
                                            puVar26 = font.tex_data[0] + 0x27f;
                                            do {
                                              *(uchar *)((long)pvVar19 + lVar38 + -2) = *puVar26;
                                              *(undefined2 *)((long)pvVar19 + lVar38 + -1) = 0;
                                              lVar38 = lVar38 + 0x780;
                                              puVar26 = puVar26 + 0x280;
                                            } while (lVar38 != 0x12c77f);
                                            lVar38 = 5;
                                            puVar26 = font.tex_data[0];
                                            do {
                                              puVar26 = puVar26 + 1;
                                              *(uchar *)((long)pvVar19 + lVar38 + -2) = *puVar26;
                                              *(undefined2 *)((long)pvVar19 + lVar38 + -1) = 0;
                                              lVar38 = lVar38 + 3;
                                            } while (lVar38 != 0x77f);
                                            lVar38 = 0x12b885;
                                            puVar26 = font.tex_data[0x27f];
                                            do {
                                              puVar26 = puVar26 + 1;
                                              *(uchar *)((long)pvVar19 + lVar38 + -2) = *puVar26;
                                              *(undefined2 *)((long)pvVar19 + lVar38 + -1) = 0;
                                              lVar38 = lVar38 + 3;
                                            } while (lVar38 != 0x12bfff);
                                            local_1c8 = pvVar19;
                                            (*glad_glActiveTexture)(0x84c0);
                                            (*glad_glGenTextures)(1,&local_16c);
                                            (*glad_glBindTexture)(0xde1,local_16c);
                                            (*glad_glTexImage2D)
                                                      (0xde1,0,0x1907,0x280,0x280,0,0x1907,0x1401,
                                                       pvVar19);
                                            (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
                                            (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
                                            (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
                                            (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
                                            window->font_atlas_texture = local_16c;
                                            free(pvVar19);
                                            GVar7 = window->program[0];
                                            (*glad_glUseProgram)(GVar7);
                                            GVar8 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"worldBlock");
                                            GVar9 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar7,GVar8,0);
                                            (*glad_glUniformBlockBinding)(GVar7,GVar9,1);
                                            p_Var5 = glad_glUniform1i;
                                            GVar16 = (*glad_glGetUniformLocation)(GVar7,"fontTex");
                                            (*p_Var5)(GVar16,0);
                                            GVar7 = window->program[1];
                                            (*glad_glUseProgram)(GVar7);
                                            GVar8 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"worldBlock");
                                            GVar9 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar7,GVar8,0);
                                            (*glad_glUniformBlockBinding)(GVar7,GVar9,1);
                                            GVar7 = window->program[3];
                                            (*glad_glUseProgram)(GVar7);
                                            GVar8 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"worldBlock");
                                            GVar9 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar7,GVar8,0);
                                            (*glad_glUniformBlockBinding)(GVar7,GVar9,1);
                                            GVar7 = window->program[4];
                                            (*glad_glUseProgram)(GVar7);
                                            GVar8 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"worldBlock");
                                            GVar9 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar7,GVar8,0);
                                            (*glad_glUniformBlockBinding)(GVar7,GVar9,1);
                                            GVar7 = window->program[2];
                                            (*glad_glUseProgram)(GVar7);
                                            GVar8 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"worldBlock");
                                            GVar9 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar7,GVar8,0);
                                            (*glad_glUniformBlockBinding)(GVar7,GVar9,1);
                                            GVar7 = window->program[5];
                                            (*glad_glUseProgram)(GVar7);
                                            GVar8 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"worldBlock");
                                            GVar9 = (*glad_glGetUniformBlockIndex)
                                                              (GVar7,"objectBlock");
                                            (*glad_glUniformBlockBinding)(GVar7,GVar8,0);
                                            (*glad_glUniformBlockBinding)(GVar7,GVar9,1);
                                            window->last_program = 5;
                                            memcpy(local_f3,
                                                  " Keyboard shortcuts:\n -------------------\n\n   [esc]   exit\n  [space]  play/pause\n     p     save .ppm screenshot\n     r     reset zoom and translation\n    h k    display/hide keyboard shortcuts\n"
                                                  ,0xc3);
                                            pbVar22 = bov_text_new(local_f3,0x88e4);
                                            window->help = pbVar22;
                                            (pbVar22->param).pos[0] = 16.0;
                                            (pbVar22->param).pos[1] = 288.0;
                                            (pbVar22->param).fontSize = 32.0;
                                            (pbVar22->param).boldness = 0.1;
                                            (pbVar22->param).outlineWidth = 0.5;
                                            (pbVar22->param).spaceType = PIXEL_SPACE;
                                            builtin_memcpy(local_118,
                                                           "press \'k\' for keyboard shortcuts\n",
                                                           0x22);
                                            pbVar22 = bov_text_new(local_118,0x88e4);
                                            window->indication = pbVar22;
                                            (pbVar22->param).pos[0] = 16.0;
                                            (pbVar22->param).pos[1] = 16.0;
                                            (pbVar22->param).fontSize = 32.0;
                                            (pbVar22->param).boldness = 0.1;
                                            (pbVar22->param).outlineWidth = 0.5;
                                            (pbVar22->param).spaceType = PIXEL_SPACE;
                                            return window;
                                          }
                                          bov_window_new_cold_2();
                                          bov_error_log(iVar6,"%s",uVar31);
                                          fprintf(_stderr,"\t(in function %s, line %d)\n",
                                                  "error_callback",0x1ac);
                                          exit(1);
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      bov_window_new_cold_3();
      goto LAB_00106cb7;
    }
  }
  glfwTerminate();
LAB_00106cc1:
  exit(1);
}

Assistant:

bov_window_t* bov_window_new(int width, int height, const char* win_name)
{
	bov_window_t* window = malloc(sizeof(bov_window_t));
	CHECK_MALLOC(window);

	glfwSetErrorCallback(error_callback);

	if(!glfwInit())
		exit(EXIT_FAILURE);

	glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
	glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
	glfwWindowHint(GLFW_SAMPLES, 0); // we disable multisampling has we already use shader antialiasing
	glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
	glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

	if(width==0 || height==0) {
		const GLFWvidmode* mode = glfwGetVideoMode(glfwGetPrimaryMonitor());
		window->size[0] = mode->width;
		window->size[1] = mode->height;
		window->self = glfwCreateWindow(mode->width, mode->height, win_name,
		                                glfwGetPrimaryMonitor(), // fullscreen
		                                NULL);
	}
	else {
		if(height<0) {
			glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
			height = -height;
		}

		if(width<0) {
			glfwWindowHint(GLFW_MAXIMIZED, GLFW_TRUE);
			width = 100;
			height = 100;
		}
		window->size[0] = width;


		window->size[1] = height;

		window->self = glfwCreateWindow(width, height, win_name, NULL, NULL);
	}

	if(!window->self) {
		glfwTerminate();
		exit(EXIT_FAILURE);
	}

	glfwMakeContextCurrent(window->self);
	glfwSetWindowUserPointer(window->self,window);

	// load opengl functions with GLAD
	if(!gladLoadGLLoader((GLADloadproc) glfwGetProcAddress))
		BOV_ERROR_LOG(BOV_GLAD_ERROR,
		              "Failed to initialize OpenGL context");

	window->param.zoom = 1.0;
	glfwGetFramebufferSize(window->self, &width, &height);
	framebuffer_size_callback(window->self, width, height);
	window->param.translate[0] = window->param.translate[1] = 0.0;
	window->wtime = DBL_MIN;

	// white background color
	window->backgroundColor[0] = 1.0;
	window->backgroundColor[1] = 1.0;
	window->backgroundColor[2] = 1.0;
	window->backgroundColor[3] = 0.0;

	// glfwSetWindowCloseCallback(window->self,close_callback);
	glfwSetKeyCallback(window->self, key_callback);
	glfwSetFramebufferSizeCallback(window->self, framebuffer_size_callback);
	glfwSetWindowSizeCallback(window->self, window_size_callback);
	glfwSetMouseButtonCallback(window->self, mouse_button_callback);
	glfwSetCursorPosCallback(window->self, cursor_pos_callback);
	glfwSetScrollCallback(window->self, scroll_callback);

	//glfwSetInputMode(window->self,GLFW_CURSOR,GLFW_CURSOR_HIDDEN);


	glfwSwapInterval(1); // vsync
	glClearColor(window->backgroundColor[0],
	             window->backgroundColor[1],
	             window->backgroundColor[2],
	             window->backgroundColor[3]);
	glEnable(GL_MULTISAMPLE);
	glEnable(GL_CULL_FACE); // cull face that are not counterclockwise
	glEnable( GL_BLEND );
	glBlendFunc( GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA );

	glPointSize(5); // 10 pixels for a point
	glEnable( GL_LINE_SMOOTH );

	glfwSetTime(DBL_MIN); // set the time to 0

	{
		double cursorX = 0.0, cursorY = 0.0;
		glfwGetCursorPos(window->self, &cursorX, &cursorY);
		window->cursorPos[0] = 2.0 * cursorX / window->size[0] - 1.0;
		window->cursorPos[1] = 2.0 * (1.0 - cursorY / window->size[1]) - 1.0;
		window->clickTime[0] = 0.0;
		window->clickTime[1] = 0.0;
	}

	window->counter = 0;
	window->running = 1;
	window->help_needed = 0;
	window->indication_needed = 0;
	window->leftClickCursor = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);

	window_OpenGL_init(window);

	window->help = bov_text_new((GLubyte[]) {
		" Keyboard shortcuts:\n"
		" -------------------\n\n"
		"   [esc]   exit\n"
		"  [space]  play/pause\n"
		"     p     save .ppm screenshot\n"
		"     r     reset zoom and translation\n"
		"    h k    display/hide keyboard shortcuts\n"
	}, GL_STATIC_DRAW);
	bov_text_set_space_type(window->help, PIXEL_SPACE);
	bov_text_set_fontsize(window->help, 32.0f); // 32 pixel height
	bov_text_set_pos(window->help, (GLfloat[2]){16.0f, 7.0f * 32.0f + 64.0f});
	bov_text_set_boldness(window->help, 0.1f);
	bov_text_set_outline_width(window->help, 0.5f);

	window->indication = bov_text_new((GLubyte[]) {
		"press 'k' for keyboard shortcuts\n"
	}, GL_STATIC_DRAW);
	bov_text_set_space_type(window->indication, PIXEL_SPACE);
	bov_text_set_fontsize(window->indication, 32.0f); // 32 pixel height
	bov_text_set_pos(window->indication, (GLfloat[2]){16.0f, 16.0f});
	bov_text_set_boldness(window->indication, 0.1f);
	bov_text_set_outline_width(window->indication, 0.5f);

	return window;
}